

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVaction INT_EVassoc_filter_action
                   (CManager_conflict cm,EVstone stone_num,FMStructDescList format_list,
                   EVSimpleHandlerFunc handler,EVstone out_stone_num,void *client_data)

{
  int iVar1;
  __pid_t _Var2;
  _proto_action *p_Var3;
  FMFormat *pp_Var4;
  FMFormat p_Var5;
  pthread_t pVar6;
  EVSimpleHandlerFunc in_RCX;
  FMStructDescList in_RDX;
  uint in_ESI;
  long in_RDI;
  int in_R8D;
  undefined8 in_R9;
  timespec ts;
  int proto_action_num;
  stone_type stone;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffff88;
  CManager_conflict in_stack_ffffffffffffff90;
  FILE *__stream;
  timespec local_60;
  uint local_4c;
  stone_type local_48;
  undefined8 local_40;
  CMTraceType trace_type;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_4;
  
  local_40 = *(undefined8 *)(in_RDI + 0x118);
  local_48 = stone_struct(in_stack_ffffffffffffff88,0);
  if (local_48 == (stone_type)0x0) {
    local_4 = 0xffffffff;
  }
  else {
    local_4c = local_48->proto_action_count;
    p_Var3 = (_proto_action *)
             INT_CMrealloc(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    local_48->proto_actions = p_Var3;
    memset(local_48->proto_actions + (int)local_4c,0,0x60);
    local_48->proto_actions[(int)local_4c].input_format_requirements = in_RDX;
    local_48->proto_actions[(int)local_4c].action_type = Action_Filter;
    local_48->proto_actions[(int)local_4c].o.term.handler = in_RCX;
    *(undefined8 *)((long)&local_48->proto_actions[(int)local_4c].o + 8) = in_R9;
    local_48->proto_actions[(int)local_4c].o.term.target_stone_id = in_R8D;
    local_48->proto_actions[(int)local_4c].data_state = Requires_Decoded;
    local_48->proto_actions[(int)local_4c].matching_reference_formats = (FMFormat *)0x0;
    if (in_RDX != (FMStructDescList)0x0) {
      pp_Var4 = (FMFormat *)INT_CMmalloc((size_t)in_stack_ffffffffffffff90);
      local_48->proto_actions[(int)local_4c].matching_reference_formats = pp_Var4;
      p_Var5 = EVregister_format_set
                         (in_stack_ffffffffffffff90,(FMStructDescList)in_stack_ffffffffffffff88);
      *local_48->proto_actions[(int)local_4c].matching_reference_formats = p_Var5;
      local_48->proto_actions[(int)local_4c].matching_reference_formats[1] = (FMFormat)0x0;
    }
    trace_type = (CMTraceType)((ulong)in_R9 >> 0x20);
    local_48->proto_action_count = local_48->proto_action_count + 1;
    clear_response_cache((stone_type)0x13e5ed);
    iVar1 = CMtrace_val[10];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar1 = CMtrace_init((CManager)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        __stream = *(FILE **)(in_RDI + 0x120);
        _Var2 = getpid();
        pVar6 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_60);
        fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
      }
      fprintf(*(FILE **)(in_RDI + 0x120),"Adding filter action %d to stone %x\n",(ulong)local_4c,
              (ulong)in_ESI);
    }
    fflush(*(FILE **)(in_RDI + 0x120));
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

EVstone
INT_EVassoc_filter_action(CManager cm, EVstone stone_num, 
		      FMStructDescList format_list, EVSimpleHandlerFunc handler,
		      EVstone out_stone_num, void *client_data)
{
#ifdef HAVE_COD_H
    event_path_data evp = cm->evp;
    stone_type stone;

    stone = stone_struct(evp, stone_num);
    if (!stone) return -1;

    int proto_action_num = stone->proto_action_count;
    stone->proto_actions = realloc(stone->proto_actions, 
				   (proto_action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[proto_action_num], 0, 
	   sizeof(stone->proto_actions[0]));
    stone->proto_actions[proto_action_num].input_format_requirements =
	format_list;
    stone->proto_actions[proto_action_num].action_type = Action_Filter;
    stone->proto_actions[proto_action_num].o.term.handler = handler;
    stone->proto_actions[proto_action_num].o.term.client_data = client_data;
    stone->proto_actions[proto_action_num].o.term.target_stone_id = out_stone_num;
    stone->proto_actions[proto_action_num].data_state = Requires_Decoded;
    stone->proto_actions[proto_action_num].matching_reference_formats = NULL;
    if (format_list != NULL) {
	stone->proto_actions[proto_action_num].matching_reference_formats = 
	    malloc(2*sizeof(FMFormat));
	stone->proto_actions[proto_action_num].matching_reference_formats[0] = 
	    EVregister_format_set(cm, format_list);
	stone->proto_actions[proto_action_num].matching_reference_formats[1] = NULL;
    }	
    stone->proto_action_count++;
    clear_response_cache(stone);
    CMtrace_out(cm, EVerbose, "Adding filter action %d to stone %x\n",
		proto_action_num, stone_num);
    return proto_action_num;
#else
    fprintf(stderr, "No code generation in FFS, action unavailable\n");
    return -1;
#endif    
}